

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O1

void __thiscall sf::VertexBuffer::VertexBuffer(VertexBuffer *this,VertexBuffer *copy)

{
  Usage UVar1;
  bool bVar2;
  ostream *poVar3;
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_00293588;
  GlResource::GlResource((GlResource *)this);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__VertexBuffer_00293890;
  this->m_buffer = 0;
  this->m_size = 0;
  UVar1 = copy->m_usage;
  this->m_primitiveType = copy->m_primitiveType;
  this->m_usage = UVar1;
  if ((copy->m_buffer != 0) && (copy->m_size != 0)) {
    bVar2 = create(this,copy->m_size);
    if (bVar2) {
      bVar2 = update(this,copy);
      if (bVar2) {
        return;
      }
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Could not copy vertex buffer",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    else {
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Could not create vertex buffer for copying",0x2a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

VertexBuffer::VertexBuffer(const VertexBuffer& copy) :
m_buffer       (0),
m_size         (0),
m_primitiveType(copy.m_primitiveType),
m_usage        (copy.m_usage)
{
    if (copy.m_buffer && copy.m_size)
    {
        if (!create(copy.m_size))
        {
            err() << "Could not create vertex buffer for copying" << std::endl;
            return;
        }

        if (!update(copy))
            err() << "Could not copy vertex buffer" << std::endl;
    }
}